

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::EnumValueToPascalCase
                   (string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 local_30;
  int i;
  bool next_upper;
  string *input_local;
  string *result;
  
  bVar1 = true;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
        ToUpper(*pcVar3);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
        ToLower(*pcVar3);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string EnumValueToPascalCase(const string& input) {
  bool next_upper = true;
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(ToUpper(input[i]));
      } else {
        result.push_back(ToLower(input[i]));
      }
      next_upper = false;
    }
  }

  return result;
}